

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

off_t cm_zlib_gztell64(gzFile file)

{
  uchar *local_30;
  gz_statep state;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local = (gzFile)0xffffffffffffffff;
  }
  else if ((file[1].have == 0x1c4f) || (file[1].have == 0x79b1)) {
    if ((int)file[4].pos == 0) {
      local_30 = (uchar *)0x0;
    }
    else {
      local_30 = file[4].next;
    }
    file_local = (gzFile)(local_30 + file->pos);
  }
  else {
    file_local = (gzFile)0xffffffffffffffff;
  }
  return (off_t)file_local;
}

Assistant:

z_off64_t ZEXPORT gztell64(gzFile file) {
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return -1;

    /* return position */
    return state->x.pos + (state->seek ? state->skip : 0);
}